

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O0

ecs_vector_t *
ecs_table_set_column(ecs_world_t *world,ecs_table_t *table,int32_t column,ecs_vector_t *vector)

{
  int16_t iVar1;
  int32_t elem_count;
  ecs_column_t *peVar2;
  ecs_vector_t *vector_00;
  int32_t count;
  ecs_vector_t *entities;
  ecs_column_t *c;
  ecs_vector_t *vector_local;
  ecs_table_t *peStack_18;
  int32_t column_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  c = (ecs_column_t *)vector;
  vector_local._4_4_ = column;
  peStack_18 = table;
  table_local = (ecs_table_t *)world;
  peVar2 = da_get_or_create_column(world,table,column);
  if (c == (ecs_column_t *)0x0) {
    vector_00 = ecs_table_get_entities(peStack_18);
    if (vector_00 != (ecs_vector_t *)0x0) {
      elem_count = ecs_vector_count(vector_00);
      c = (ecs_column_t *)ecs_table_get_column(peStack_18,vector_local._4_4_);
      if ((ecs_vector_t *)c == (ecs_vector_t *)0x0) {
        if (peVar2->alignment < 0x10) {
          iVar1 = 0x10;
        }
        else {
          iVar1 = peVar2->alignment;
        }
        c = (ecs_column_t *)_ecs_vector_new((int)peVar2->size,iVar1,elem_count);
      }
      else {
        if (peVar2->alignment < 0x10) {
          iVar1 = 0x10;
        }
        else {
          iVar1 = peVar2->alignment;
        }
        _ecs_vector_set_count((ecs_vector_t **)&c,(int)peVar2->size,iVar1,elem_count);
      }
    }
  }
  else {
    ecs_vector_assert_size((ecs_vector_t *)c,(int)peVar2->size);
  }
  peVar2->data = (ecs_vector_t *)c;
  return (ecs_vector_t *)c;
}

Assistant:

ecs_vector_t* ecs_table_set_column(
    ecs_world_t *world,
    ecs_table_t *table,
    int32_t column,
    ecs_vector_t* vector)
{
    ecs_column_t *c = da_get_or_create_column(world, table, column);
    if (vector) {
        ecs_vector_assert_size(vector, c->size);
    } else {
        ecs_vector_t *entities = ecs_table_get_entities(table);
        if (entities) {
            int32_t count = ecs_vector_count(entities);
            vector = ecs_table_get_column(table, column);
            if (!vector) {
                vector = ecs_vector_new_t(c->size, c->alignment, count);
            } else {
                ecs_vector_set_count_t(&vector, c->size, c->alignment, count);
            }
        }
    }
    c->data = vector;
    
    return vector;
}